

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O1

void __thiscall
wasm::ThreadPool::work
          (ThreadPool *this,
          vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
          *doWorkers)

{
  pointer puVar1;
  pointer puVar2;
  __uniq_ptr_data<wasm::Thread,_std::default_delete<wasm::Thread>,_true,_true> this_00;
  _Any_data *p_Var3;
  int iVar4;
  ThreadWorkState TVar5;
  long lVar6;
  long lVar7;
  _Any_data local_70;
  code *local_60;
  vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
  *local_50;
  long local_48;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  
  puVar1 = (this->threads).
           super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->threads).
           super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar2 - (long)puVar1;
  if (lVar6 == 0) {
    if ((doWorkers->
        super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (doWorkers->
        super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("doWorkers.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xb1,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    do {
      p_Var3 = (_Any_data *)
               (doWorkers->
               super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)(p_Var3 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      TVar5 = (**(code **)((long)p_Var3 + 0x18))(p_Var3);
    } while (TVar5 == More);
  }
  else {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)workMutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    lVar6 = lVar6 >> 3;
    if ((long)(doWorkers->
              super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(doWorkers->
              super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5 != lVar6) {
      __assert_fail("doWorkers.size() == num",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xbc,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    if (this->running == true) {
      __assert_fail("!running",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xbd,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    this->running = true;
    local_40 = (undefined1  [8])threadMutex;
    lock._M_device._0_1_ = 0;
    local_50 = doWorkers;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    lock._M_device._0_1_ = 1;
    resetThreadsAreReady(this);
    if (puVar2 != puVar1) {
      local_48 = lVar6 + (ulong)(lVar6 == 0);
      lVar6 = 0;
      lVar7 = 0;
      do {
        this_00.super___uniq_ptr_impl<wasm::Thread,_std::default_delete<wasm::Thread>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Thread_*,_std::default_delete<wasm::Thread>_>.
        super__Head_base<0UL,_wasm::Thread_*,_false>._M_head_impl =
             (this->threads).
             super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t.
             super___uniq_ptr_impl<wasm::Thread,_std::default_delete<wasm::Thread>_>;
        std::function<wasm::ThreadWorkState_()>::function
                  ((function<wasm::ThreadWorkState_()> *)&local_70,
                   (function<wasm::ThreadWorkState_()> *)
                   ((long)&(((local_50->
                             super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                           _M_functor + lVar6));
        Thread::work((Thread *)
                     this_00.super___uniq_ptr_impl<wasm::Thread,_std::default_delete<wasm::Thread>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::Thread_*,_std::default_delete<wasm::Thread>_>.
                     super__Head_base<0UL,_wasm::Thread_*,_false>._M_head_impl,
                     (function<wasm::ThreadWorkState_()> *)&local_70);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (local_48 != lVar7);
    }
    if ((this->ready).super___atomic_base<unsigned_long>._M_i !=
        (long)(this->threads).
              super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->threads).
              super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      do {
        std::condition_variable::wait((unique_lock *)&this->condition);
      } while ((this->ready).super___atomic_base<unsigned_long>._M_i !=
               (long)(this->threads).
                     super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->threads).
                     super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    this->running = false;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    pthread_mutex_unlock((pthread_mutex_t *)workMutex);
  }
  return;
}

Assistant:

void ThreadPool::work(
  std::vector<std::function<ThreadWorkState()>>& doWorkers) {
  size_t num = threads.size();
  // If no multiple cores, or on a side thread, do not use worker threads
  if (num == 0) {
    // just run sequentially
    DEBUG_POOL("work() sequentially\n");
    assert(doWorkers.size() > 0);
    while (doWorkers[0]() == ThreadWorkState::More) {
    }
    return;
  }
  // run in parallel on threads
  // TODO: fancy work stealing
  DEBUG_POOL("work() on threads\n");
  // lock globally on doing work in the pool - the threadPool can only be used
  // from one thread at a time, all others must wait patiently
  std::lock_guard<std::mutex> poolLock(workMutex);
  assert(doWorkers.size() == num);
  assert(!running);
  DEBUG_POOL("running = true\n");
  running = true;
  std::unique_lock<std::mutex> lock(threadMutex);
  resetThreadsAreReady();
  for (size_t i = 0; i < num; i++) {
    threads[i]->work(doWorkers[i]);
  }
  DEBUG_POOL("main thread waiting\n");
  condition.wait(lock, [this]() { return areThreadsReady(); });
  DEBUG_POOL("main thread done waiting\n");
  DEBUG_POOL("running = false\n");
  running = false;
  DEBUG_POOL("work() is done\n");
}